

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264.h
# Opt level: O0

int h264_is_submb_mb_type(uint32_t mb_type)

{
  int local_c;
  uint32_t mb_type_local;
  
  if ((mb_type - 0x1e < 2) || (mb_type == 0x37)) {
    local_c = 1;
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

static inline int h264_is_submb_mb_type(uint32_t mb_type) {
	switch (mb_type) {
		case H264_MB_TYPE_P_8X8:
		case H264_MB_TYPE_P_8X8REF0:
		case H264_MB_TYPE_B_8X8:
			return 1;
		default:
			return 0;
	}
}